

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O0

void __thiscall icu_63::RuleBasedTimeZone::deleteRules(RuleBasedTimeZone *this)

{
  UBool UVar1;
  long *plVar2;
  RuleBasedTimeZone *this_local;
  
  if (this->fInitialRule != (InitialTimeZoneRule *)0x0) {
    (*(this->fInitialRule->super_TimeZoneRule).super_UObject._vptr_UObject[1])();
  }
  this->fInitialRule = (InitialTimeZoneRule *)0x0;
  if (this->fHistoricRules != (UVector *)0x0) {
    while (UVar1 = UVector::isEmpty(this->fHistoricRules), UVar1 == '\0') {
      plVar2 = (long *)UVector::orphanElementAt(this->fHistoricRules,0);
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 8))();
      }
    }
    if (this->fHistoricRules != (UVector *)0x0) {
      (*(this->fHistoricRules->super_UObject)._vptr_UObject[1])();
    }
    this->fHistoricRules = (UVector *)0x0;
  }
  if (this->fFinalRules != (UVector *)0x0) {
    while (UVar1 = UVector::isEmpty(this->fFinalRules), UVar1 == '\0') {
      plVar2 = (long *)UVector::orphanElementAt(this->fFinalRules,0);
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 8))();
      }
    }
    if (this->fFinalRules != (UVector *)0x0) {
      (*(this->fFinalRules->super_UObject)._vptr_UObject[1])();
    }
    this->fFinalRules = (UVector *)0x0;
  }
  return;
}

Assistant:

void
RuleBasedTimeZone::deleteRules(void) {
    delete fInitialRule;
    fInitialRule = NULL;
    if (fHistoricRules != NULL) {
        while (!fHistoricRules->isEmpty()) {
            delete (TimeZoneRule*)(fHistoricRules->orphanElementAt(0));
        }
        delete fHistoricRules;
        fHistoricRules = NULL;
    }
    if (fFinalRules != NULL) {
        while (!fFinalRules->isEmpty()) {
            delete (AnnualTimeZoneRule*)(fFinalRules->orphanElementAt(0));
        }
        delete fFinalRules;
        fFinalRules = NULL;
    }
}